

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O0

int coda_cursor_use_base_type_of_special_type(coda_cursor *cursor)

{
  coda_backend cVar1;
  int iVar2;
  char *pcVar3;
  long *in_FS_OFFSET;
  coda_type *local_38;
  coda_type *local_28;
  coda_type *type;
  coda_cursor *cursor_local;
  
  if (((cursor == (coda_cursor *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n + -1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x576);
    cursor_local._4_4_ = -1;
  }
  else {
    if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
      local_28 = (coda_type *)cursor->stack[cursor->n + -1].type;
    }
    else {
      local_28 = (cursor->stack[cursor->n + -1].type)->definition;
    }
    if (local_28->type_class == 6) {
      cVar1 = (cursor->stack[cursor->n + -1].type)->backend;
      if (cVar1 < 2) {
        iVar2 = coda_ascbin_cursor_use_base_type_of_special_type(cursor);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else if (cVar1 == coda_backend_memory) {
        iVar2 = coda_mem_cursor_use_base_type_of_special_type(cursor);
        if (iVar2 != 0) {
          return -1;
        }
      }
      else {
        if (cVar1 - coda_backend_hdf4 < 2) {
LAB_0017fcdd:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                        ,0x59b,"int coda_cursor_use_base_type_of_special_type(coda_cursor *)");
        }
        if (cVar1 == coda_backend_cdf) {
          iVar2 = coda_cdf_cursor_use_base_type_of_special_type(cursor);
          if (iVar2 != 0) {
            return -1;
          }
        }
        else if (cVar1 - coda_backend_netcdf < 2) goto LAB_0017fcdd;
      }
      if ((cursor->stack[cursor->n + -1].type)->backend == coda_backend_memory) {
        coda_mem_cursor_update_offset(cursor);
      }
      if (*(int *)(*in_FS_OFFSET + -0xe8) != 0) {
        if ((cursor->stack[cursor->n + -1].type)->backend < coda_backend_memory) {
          local_38 = (coda_type *)cursor->stack[cursor->n + -1].type;
        }
        else {
          local_38 = (cursor->stack[cursor->n + -1].type)->definition;
        }
        if ((local_38->type_class == 6) &&
           (iVar2 = coda_cursor_use_base_type_of_special_type(cursor), iVar2 != 0)) {
          return -1;
        }
      }
      cursor_local._4_4_ = 0;
    }
    else {
      pcVar3 = coda_type_get_class_name(local_28->type_class);
      coda_set_error(-0x69,"cursor does not refer to a special type (current type is %s)",pcVar3);
      cursor_local._4_4_ = -1;
    }
  }
  return cursor_local._4_4_;
}

Assistant:

LIBCODA_API int coda_cursor_use_base_type_of_special_type(coda_cursor *cursor)
{
    coda_type *type;

    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (type->type_class != coda_special_class)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a special type (current type is %s)",
                       coda_type_get_class_name(type->type_class));
        return -1;
    }

    switch (cursor->stack[cursor->n - 1].type->backend)
    {
        case coda_backend_ascii:
        case coda_backend_binary:
            if (coda_ascbin_cursor_use_base_type_of_special_type(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_memory:
            if (coda_mem_cursor_use_base_type_of_special_type(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_cdf:
            if (coda_cdf_cursor_use_base_type_of_special_type(cursor) != 0)
            {
                return -1;
            }
            break;
        case coda_backend_hdf4:
        case coda_backend_hdf5:
        case coda_backend_netcdf:
        case coda_backend_grib:
            assert(0);
            exit(1);
    }

    if (cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        coda_mem_cursor_update_offset(cursor);
    }

    if (coda_option_bypass_special_types &&
        coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->type_class == coda_special_class)
    {
        if (coda_cursor_use_base_type_of_special_type(cursor) != 0)
        {
            return -1;
        }
    }

    return 0;
}